

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Line_AlignFloor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  bool bVar1;
  int linenum;
  byte bVar2;
  FLineIdIterator local_20;
  
  local_20.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
  bVar2 = 0;
  local_20.searchtag = arg0;
  while( true ) {
    linenum = FLineIdIterator::Next(&local_20);
    if (linenum < 0) break;
    bVar1 = P_AlignFlat(linenum,(uint)(arg1 != 0),0);
    bVar2 = bVar2 | bVar1;
  }
  return (uint)bVar2;
}

Assistant:

FUNC(LS_Line_AlignFloor)
// Line_AlignFloor (lineid, side)
{
	bool ret = 0;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		ret |= P_AlignFlat (line, !!arg1, 0);
	}
	return ret;
}